

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_offset_st_2regs(DisasContext_conflict14 *ctx,TCGv_i32 rh,TCGv_i32 rl,TCGv_i32 base,
                        int16_t con)

{
  TCGContext_conflict9 *tcg_ctx_00;
  TCGv_i32 ret;
  TCGv_i32 temp;
  TCGContext_conflict9 *tcg_ctx;
  int16_t con_local;
  TCGv_i32 base_local;
  TCGv_i32 rl_local;
  TCGv_i32 rh_local;
  DisasContext_conflict14 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  ret = tcg_temp_new_i32(tcg_ctx_00);
  tcg_gen_addi_i32_tricore(tcg_ctx_00,ret,base,(int)con);
  gen_st_2regs_64(ctx,rh,rl,ret);
  tcg_temp_free_i32(tcg_ctx_00,ret);
  return;
}

Assistant:

static void gen_offset_st_2regs(DisasContext *ctx, TCGv rh, TCGv rl, TCGv base, int16_t con)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    TCGv temp = tcg_temp_new(tcg_ctx);
    tcg_gen_addi_tl(tcg_ctx, temp, base, con);
    gen_st_2regs_64(ctx, rh, rl, temp);
    tcg_temp_free(tcg_ctx, temp);
}